

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bidirectional.cc
# Opt level: O2

bool __thiscall
bidirectional::BiDirectional::checkValidLabel
          (BiDirectional *this,Directions *direction,Label *label)

{
  DiGraph *pDVar1;
  Params *pPVar2;
  bool bVar3;
  
  if ((label->vertex).lemon_id == -1) {
    return false;
  }
  pDVar1 = (this->graph_ptr_)._M_t.
           super___uniq_ptr_impl<bidirectional::DiGraph,_std::default_delete<bidirectional::DiGraph>_>
           ._M_t.
           super__Tuple_impl<0UL,_bidirectional::DiGraph_*,_std::default_delete<bidirectional::DiGraph>_>
           .super__Head_base<0UL,_bidirectional::DiGraph_*,_false>._M_head_impl;
  bVar3 = labelling::Label::checkStPath(label,&(pDVar1->source).user_id,&(pDVar1->sink).user_id);
  if (((bVar3) &&
      (pPVar2 = (this->params_ptr_)._M_t.
                super___uniq_ptr_impl<bidirectional::Params,_std::default_delete<bidirectional::Params>_>
                ._M_t.
                super__Tuple_impl<0UL,_bidirectional::Params_*,_std::default_delete<bidirectional::Params>_>
                .super__Head_base<0UL,_bidirectional::Params_*,_false>._M_head_impl,
      !NAN(pPVar2->threshold))) &&
     (bVar3 = labelling::Label::checkThreshold(label,&pPVar2->threshold), bVar3)) {
    this->terminated_early_w_st_path_ = true;
    this->terminated_early_w_st_path_direction_ = *direction;
    return true;
  }
  return false;
}

Assistant:

bool BiDirectional::checkValidLabel(
    const Directions&       direction,
    const labelling::Label& label) {
  if (label.vertex.lemon_id != -1 &&
      label.checkStPath(graph_ptr_->source.user_id, graph_ptr_->sink.user_id)) {
    if (!std::isnan(params_ptr_->threshold) &&
        label.checkThreshold(params_ptr_->threshold)) {
      terminated_early_w_st_path_           = true;
      terminated_early_w_st_path_direction_ = direction;
      return true;
    }
  }
  return false;
}